

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

void __thiscall
Js::FunctionExecutionStateMachine::SetFullJitThreshold
          (FunctionExecutionStateMachine *this,uint16 newFullJitThreshold,bool skipSimpleJit)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  bool bVar4;
  bool bVar5;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar6;
  Type *limit;
  undefined1 local_48 [8];
  anon_class_16_2_023ad54b ScaleLimit;
  int scale;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x158,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) goto LAB_006e4698;
    *puVar6 = 0;
  }
  EVar3 = GetExecutionMode(this);
  if (EVar3 == FullJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x159,"(GetExecutionMode() != ExecutionMode::FullJit)",
                                "GetExecutionMode() != ExecutionMode::FullJit");
    if (!bVar2) goto LAB_006e4698;
    *puVar6 = 0;
  }
  ScaleLimit.this._4_4_ = (uint)newFullJitThreshold - (uint)this->fullJitThreshold;
  if (this->fullJitThreshold == newFullJitThreshold) {
    VerifyExecutionModeLimits(this);
    return;
  }
  this->fullJitThreshold = newFullJitThreshold;
  local_48 = (undefined1  [8])((long)&ScaleLimit.this + 4);
  ScaleLimit.scale = (int *)this;
  bVar2 = FunctionBody::DoSimpleJit((this->owner).ptr);
  bVar4 = FunctionBody::DoInterpreterProfile((this->owner).ptr);
  if (((!bVar2) || (DAT_01441e6c == 0)) ||
     (bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)local_48,&this->simpleJitLimit), !bVar5)) {
    if (bVar4) {
      bVar5 = FunctionBody::DoInterpreterAutoProfile((this->owner).ptr);
      if ((!bVar5) ||
         ((bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                             ((anon_class_16_2_023ad54b *)local_48,
                              &this->autoProfilingInterpreter1Limit), !bVar5 &&
          (bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                             ((anon_class_16_2_023ad54b *)local_48,
                              &this->autoProfilingInterpreter0Limit), !bVar5)))) {
        if (DAT_01441e6c == 0) {
          bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                            ((anon_class_16_2_023ad54b *)local_48,&this->profilingInterpreter0Limit)
          ;
          if (!bVar5) {
            if (bVar2) goto LAB_006e44d2;
            goto LAB_006e44e8;
          }
        }
        else {
          bVar2 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                            ((anon_class_16_2_023ad54b *)local_48,&this->profilingInterpreter1Limit)
          ;
          if (!bVar2) {
            limit = &this->profilingInterpreter0Limit;
LAB_006e44ec:
            bVar2 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                              ((anon_class_16_2_023ad54b *)local_48,limit);
            goto LAB_006e44f5;
          }
        }
      }
    }
    else {
      bVar5 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                        ((anon_class_16_2_023ad54b *)local_48,&this->interpreterLimit);
      if (!bVar5) {
        if (bVar2 && DAT_01441e6c == 0) {
LAB_006e44d2:
          bVar2 = SetFullJitThreshold::anon_class_16_2_023ad54b::operator()
                            ((anon_class_16_2_023ad54b *)local_48,&this->simpleJitLimit);
          if (bVar4 && !bVar2) {
LAB_006e44e8:
            limit = &this->profilingInterpreter1Limit;
            goto LAB_006e44ec;
          }
LAB_006e44f5:
          if (bVar2 != false) goto LAB_006e454b;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                    ,0x199,"(fullyScaled)","fullyScaled");
        if (!bVar2) goto LAB_006e4698;
        *puVar6 = 0;
      }
    }
  }
LAB_006e454b:
  if (ScaleLimit.this._4_4_ != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x19a,"(scale == 0)","scale == 0");
    if (!bVar2) goto LAB_006e4698;
    *puVar6 = 0;
  }
  EVar3 = GetExecutionMode(this);
  if (EVar3 != SimpleJit) {
    bVar2 = IsInterpreterExecutionMode(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                  ,0x19e,"(IsInterpreterExecutionMode())",
                                  "IsInterpreterExecutionMode()");
      if (!bVar2) {
LAB_006e4698:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    if ((skipSimpleJit || this->simpleJitLimit < 0x10) && this->simpleJitLimit != 0) {
      sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)(this->owner).ptr);
      functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)(this->owner).ptr);
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01436260,SimpleJitPhase,sourceContextId,functionId);
      if (!bVar2) {
        (&this->autoProfilingInterpreter1Limit)[(ulong)(DAT_01441e6c ^ 1) * 2] =
             (&this->autoProfilingInterpreter1Limit)[(ulong)(DAT_01441e6c ^ 1) * 2] +
             this->simpleJitLimit;
        this->simpleJitLimit = 0;
        TryTransitionToNextInterpreterExecutionMode(this);
      }
    }
  }
  VerifyExecutionModeLimits(this);
  return;
}

Assistant:

void FunctionExecutionStateMachine::SetFullJitThreshold(const uint16 newFullJitThreshold, const bool skipSimpleJit)
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(GetExecutionMode() != ExecutionMode::FullJit);

        int scale = newFullJitThreshold - fullJitThreshold;
        if (scale == 0)
        {
            VerifyExecutionModeLimits();
            return;
        }
        fullJitThreshold = newFullJitThreshold;

        const auto ScaleLimit = [&](uint16 &limit) -> bool
        {
            Assert(scale != 0);
            const int limitScale = max(-static_cast<int>(limit), scale);
            const int newLimit = limit + limitScale;
            Assert(static_cast<int>(static_cast<uint16>(newLimit)) == newLimit);
            limit = static_cast<uint16>(newLimit);
            scale -= limitScale;
            Assert(limit == 0 || scale == 0);

            if (&limit == &simpleJitLimit)
            {
                FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();
                if (owner->GetDefaultFunctionEntryPointInfo() == simpleJitEntryPointInfo)
                {
                    Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
                    const int newSimpleJitCallCount = max(0, (int)simpleJitEntryPointInfo->callsCount + limitScale);
                    Assert(static_cast<int>(static_cast<uint16>(newSimpleJitCallCount)) == newSimpleJitCallCount);
                    SetSimpleJitCallCount(static_cast<uint16>(newSimpleJitCallCount));
                }
            }

            return scale == 0;
        };

        /*
        Determine which execution mode's limit scales with the full JIT threshold, in order of preference:
        - New simple JIT
        - Auto-profiling interpreter 1
        - Auto-profiling interpreter 0
        - Interpreter
        - Profiling interpreter 0 (when using old simple JIT)
        - Old simple JIT
        - Profiling interpreter 1
        - Profiling interpreter 0 (when using new simple JIT)
        */
        const bool doSimpleJit = owner->DoSimpleJit();
        const bool doInterpreterProfile = owner->DoInterpreterProfile();
        const bool fullyScaled =
            (CONFIG_FLAG(NewSimpleJit) && doSimpleJit && ScaleLimit(simpleJitLimit)) ||
            (
                doInterpreterProfile
                ? owner->DoInterpreterAutoProfile() &&
                (ScaleLimit(autoProfilingInterpreter1Limit) || ScaleLimit(autoProfilingInterpreter0Limit))
                : ScaleLimit(interpreterLimit)
                ) ||
                (
                    CONFIG_FLAG(NewSimpleJit)
                    ? doInterpreterProfile &&
                    (ScaleLimit(profilingInterpreter1Limit) || ScaleLimit(profilingInterpreter0Limit))
                    : (doInterpreterProfile && ScaleLimit(profilingInterpreter0Limit)) ||
                    (doSimpleJit && ScaleLimit(simpleJitLimit)) ||
                    (doInterpreterProfile && ScaleLimit(profilingInterpreter1Limit))
                    );
        Assert(fullyScaled);
        Assert(scale == 0);

        if (GetExecutionMode() != ExecutionMode::SimpleJit)
        {
            Assert(IsInterpreterExecutionMode());
            if (simpleJitLimit != 0 &&
                (skipSimpleJit || simpleJitLimit < DEFAULT_CONFIG_MinSimpleJitIterations) &&
                !PHASE_FORCE(Phase::SimpleJitPhase, owner))
            {
                // Simple JIT code has not yet been generated, and was either requested to be skipped, or the limit was scaled
                // down too much. Skip simple JIT by moving any remaining iterations to an equivalent interpreter execution
                // mode.
                (CONFIG_FLAG(NewSimpleJit) ? autoProfilingInterpreter1Limit : profilingInterpreter1Limit) += simpleJitLimit;
                simpleJitLimit = 0;
                TryTransitionToNextInterpreterExecutionMode();
            }
        }

        VerifyExecutionModeLimits();
    }